

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O3

void __thiscall
celero::ThreadTestFixture::startThreads
          (ThreadTestFixture *this,uint64_t threads,uint64_t iterations)

{
  _Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Result_base *this_01;
  _State_baseV2 *__tmp;
  _func_int **pp_Var2;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_80;
  __state_type local_78;
  _func_int **local_68 [2];
  undefined **local_58;
  ulong local_50;
  _func_int **local_48;
  __basic_future<void> local_40;
  
  local_50 = iterations / threads;
  local_48 = (_func_int **)(threads + (threads == 0));
  local_58 = &PTR__M_destroy_00145b18;
  pp_Var2 = (_func_int **)0x0;
  do {
    this_00._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ThreadTestFixture::Impl,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ThreadTestFixture::Impl_*,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         .super__Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false>._M_head_impl;
    local_78.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_78.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001459a8;
    p_Var1[1]._M_use_count = 0;
    p_Var1[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var1[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var1[2]._M_use_count = 0;
    p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var1[3]._M_use_count = 0;
    p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001459f8;
    this_01 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)(this_01 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(this_01);
    *(undefined ***)this_01 = local_58;
    p_Var1[4]._vptr__Sp_counted_base = (_func_int **)this_01;
    *(ThreadTestFixture **)&p_Var1[4]._M_use_count = this;
    p_Var1[5]._vptr__Sp_counted_base = pp_Var2;
    p_Var1[5]._M_use_count = (undefined4)local_50;
    p_Var1[5]._M_weak_count = local_50._4_4_;
    local_68[0] = (_func_int **)0x0;
    local_80 = (long *)operator_new(0x20);
    *local_80 = (long)&PTR___State_00145a50;
    local_80[1] = (long)(p_Var1 + 1);
    local_80[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>
                        ::_M_run;
    local_80[3] = 0;
    std::thread::_M_start_thread(local_68,&local_80,0);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    if (p_Var1[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
      std::terminate();
    }
    p_Var1[3]._vptr__Sp_counted_base = local_68[0];
    local_78.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var1 + 1);
    local_78.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    std::__basic_future<void>::__basic_future(&local_40,&local_78);
    if (local_78.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)this_00._M_head_impl,
               (future<void> *)&local_40);
    if (local_40._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pp_Var2 = (_func_int **)((long)pp_Var2 + 1);
  } while (local_48 != pp_Var2);
  return;
}

Assistant:

void ThreadTestFixture::startThreads(uint64_t threads, uint64_t iterations)
{
	const uint64_t iterationsPerThread = iterations / threads;

	for(uint64_t i = 0; i < threads; ++i)
	{
		try
		{
			this->pimpl->futures.push_back(
				// std::async(std::launch::deferred,
				std::async(std::launch::async, [this, i, iterationsPerThread]() {
					this->pimpl->currentThreadId = i + 1;
					for(auto threadIterationCounter = size_t(0); threadIterationCounter < iterationsPerThread;)
					{
						this->pimpl->currentCallId = ++threadIterationCounter;
						this->UserBenchmark();
					}
				}));
		}
		catch(std::system_error& e)
		{
			std::cerr << "ERROR: Exception. Error Code: " << e.code() << ", " << e.what() << std::endl;
		}
	}
}